

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall kratos::Generator::clear_remove_stmt_cache(Generator *this)

{
  unordered_set<std::shared_ptr<kratos::Stmt>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  *this_00;
  key_type *pkVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __node_base_ptr p_Var4;
  key_type *pkVar5;
  long lVar6;
  pointer psVar7;
  iterator __first;
  
  psVar7 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pkVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pkVar1 - (long)psVar7 >> 6;
  if (0 < lVar6) {
    this_00 = &this->stmts_remove_cache_;
    lVar6 = lVar6 + 1;
    psVar7 = psVar7 + 2;
    do {
      pkVar5 = psVar7;
      peVar2 = pkVar5[-2].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = std::
               _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::_M_find_before_node
                         (&this_00->_M_h,
                          (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,
                          pkVar5 + -2,(__hash_code)peVar2);
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (__first._M_current = pkVar5 + -2, p_Var4->_M_nxt != (_Hash_node_base *)0x0))
      goto LAB_0018dc4e;
      peVar2 = pkVar5[-1].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = std::
               _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::_M_find_before_node
                         (&this_00->_M_h,
                          (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,
                          pkVar5 + -1,(__hash_code)peVar2);
      if (((p_Var4 != (__node_base_ptr)0x0) &&
          (__first._M_current = pkVar5 + -1, p_Var4->_M_nxt != (_Hash_node_base *)0x0)) ||
         ((peVar2 = (pkVar5->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
          p_Var4 = std::
                   _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::_M_find_before_node
                             (&this_00->_M_h,
                              (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,
                              pkVar5,(__hash_code)peVar2), p_Var4 != (__node_base_ptr)0x0 &&
          (__first._M_current = pkVar5, p_Var4->_M_nxt != (_Hash_node_base *)0x0))))
      goto LAB_0018dc4e;
      peVar2 = pkVar5[1].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = std::
               _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::_M_find_before_node
                         (&this_00->_M_h,
                          (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,
                          pkVar5 + 1,(__hash_code)peVar2);
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (__first._M_current = pkVar5 + 1, p_Var4->_M_nxt != (_Hash_node_base *)0x0))
      goto LAB_0018dc4e;
      lVar6 = lVar6 + -1;
      psVar7 = pkVar5 + 4;
    } while (1 < lVar6);
    psVar7 = pkVar5 + 2;
  }
  lVar6 = (long)pkVar1 - (long)psVar7 >> 4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      __first._M_current = pkVar1;
      if ((lVar6 != 3) ||
         ((peVar2 = (psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
          p_Var4 = std::
                   _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::_M_find_before_node
                             (&(this->stmts_remove_cache_)._M_h,
                              (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,
                              psVar7,(__hash_code)peVar2), p_Var4 != (__node_base_ptr)0x0 &&
          (__first._M_current = psVar7, p_Var4->_M_nxt != (_Hash_node_base *)0x0))))
      goto LAB_0018dc4e;
      psVar7 = psVar7 + 1;
    }
    peVar2 = (psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = std::
             _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::_M_find_before_node
                       (&(this->stmts_remove_cache_)._M_h,
                        (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,psVar7,
                        (__hash_code)peVar2);
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (__first._M_current = psVar7, p_Var4->_M_nxt != (_Hash_node_base *)0x0)) goto LAB_0018dc4e;
    psVar7 = psVar7 + 1;
  }
  peVar2 = (psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = std::
           _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::_M_find_before_node
                     (&(this->stmts_remove_cache_)._M_h,
                      (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,psVar7,
                      (__hash_code)peVar2);
  __first._M_current = pkVar1;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (__first._M_current = psVar7, p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
    __first._M_current = pkVar1;
  }
LAB_0018dc4e:
  if ((__first._M_current != pkVar1) && (pkVar5 = __first._M_current + 1, pkVar5 != pkVar1)) {
    do {
      peVar2 = (pkVar5->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var4 = std::
               _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::_M_find_before_node
                         (&(this->stmts_remove_cache_)._M_h,
                          (ulong)peVar2 % (this->stmts_remove_cache_)._M_h._M_bucket_count,pkVar5,
                          (__hash_code)peVar2);
      if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
        peVar2 = (pkVar5->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var3 = (pkVar5->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        (pkVar5->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (pkVar5->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = ((__first._M_current)->
                  super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        ((__first._M_current)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = peVar2;
        ((__first._M_current)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var3;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        __first._M_current = __first._M_current + 1;
      }
      pkVar5 = pkVar5 + 1;
    } while (pkVar5 != pkVar1);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  _M_erase(&this->stmts_,__first,
           (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->stmts_remove_cache_)._M_h);
  return;
}

Assistant:

void Generator::clear_remove_stmt_cache() {
    stmts_.erase(std::remove_if(stmts_.begin(), stmts_.end(),
                                [this](auto const &stmt) {
                                    return stmts_remove_cache_.find(stmt) !=
                                           stmts_remove_cache_.end();
                                }),
                 stmts_.end());

    stmts_remove_cache_.clear();
}